

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3VectorFieldSubexpr(Expr *pVector,int i)

{
  int iVar1;
  int i_local;
  Expr *pVector_local;
  
  iVar1 = sqlite3ExprIsVector(pVector);
  pVector_local = pVector;
  if (iVar1 != 0) {
    if ((pVector->op == 0x83) || (pVector->op2 == 0x83)) {
      pVector_local = ((pVector->x).pSelect)->pEList->a[i].pExpr;
    }
    else {
      pVector_local = ((pVector->x).pList)->a[i].pExpr;
    }
  }
  return pVector_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3VectorFieldSubexpr(Expr *pVector, int i){
  assert( i<sqlite3ExprVectorSize(pVector) );
  if( sqlite3ExprIsVector(pVector) ){
    assert( pVector->op2==0 || pVector->op==TK_REGISTER );
    if( pVector->op==TK_SELECT || pVector->op2==TK_SELECT ){
      return pVector->x.pSelect->pEList->a[i].pExpr;
    }else{
      return pVector->x.pList->a[i].pExpr;
    }
  }
  return pVector;
}